

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

World * __thiscall
despot::PlannerBase::InitializePOMDPWorld
          (PlannerBase *this,string *world_type,DSPOMDP *model,Option *options)

{
  uint seed;
  POMDPWorld *this_00;
  POMDPWorld *world;
  Option *options_local;
  DSPOMDP *model_local;
  string *world_type_local;
  PlannerBase *this_local;
  
  std::__cxx11::string::operator=((string *)world_type,"pomdp");
  this_00 = (POMDPWorld *)operator_new(0x28);
  seed = Seeds::Next();
  POMDPWorld::POMDPWorld(this_00,model,seed);
  (*(this_00->super_World)._vptr_World[2])();
  (*(this_00->super_World)._vptr_World[3])();
  return &this_00->super_World;
}

Assistant:

World* PlannerBase::InitializePOMDPWorld(string& world_type, DSPOMDP *model,
		option::Option* options) {
	//Create world: use POMDP model
	world_type = "pomdp";
	POMDPWorld* world = new POMDPWorld(model, Seeds::Next());
	//Establish connection: do nothing
	world->Connect();
	//Initialize: create start state
	world->Initialize();
	return world;
}